

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zes_libapi.cpp
# Opt level: O3

ze_result_t zesEngineGetActivity(zes_engine_handle_t hEngine,zes_engine_stats_t *pStats)

{
  code *UNRECOVERED_JUMPTABLE;
  ze_result_t zVar1;
  
  zVar1 = ZE_RESULT_ERROR_UNINITIALIZED;
  if (ze_lib::destruction == '\0') {
    UNRECOVERED_JUMPTABLE = *(code **)(*(long *)(ze_lib::context + 0x20) + 0x2e8);
    if (UNRECOVERED_JUMPTABLE != (code *)0x0) {
      zVar1 = (*UNRECOVERED_JUMPTABLE)();
      return zVar1;
    }
    zVar1 = (uint)*(byte *)(ze_lib::context + 0xd90) * 2 + ZE_RESULT_ERROR_UNINITIALIZED;
  }
  return zVar1;
}

Assistant:

ze_result_t ZE_APICALL
zesEngineGetActivity(
    zes_engine_handle_t hEngine,                    ///< [in] Handle for the component.
    zes_engine_stats_t* pStats                      ///< [in,out] Will contain a snapshot of the engine group activity
                                                    ///< counters.
    )
{
    #ifdef DYNAMIC_LOAD_LOADER
    ze_result_t result = ZE_RESULT_SUCCESS;
    if(ze_lib::destruction) {
        return ZE_RESULT_ERROR_UNINITIALIZED;
    }
    static const zes_pfnEngineGetActivity_t pfnGetActivity = [&result] {
        auto pfnGetActivity = ze_lib::context->zesDdiTable.load()->Engine.pfnGetActivity;
        if( nullptr == pfnGetActivity ) {
            result = ZE_RESULT_ERROR_UNSUPPORTED_FEATURE;
        }
        return pfnGetActivity;
    }();
    if (result != ZE_RESULT_SUCCESS) {
        return result;
    }
    return pfnGetActivity( hEngine, pStats );
    #else
    if(ze_lib::destruction) {
        return ZE_RESULT_ERROR_UNINITIALIZED;
    }

    auto pfnGetActivity = ze_lib::context->zesDdiTable.load()->Engine.pfnGetActivity;
    if( nullptr == pfnGetActivity ) {
        if(!ze_lib::context->isInitialized)
            return ZE_RESULT_ERROR_UNINITIALIZED;
        else
            return ZE_RESULT_ERROR_UNSUPPORTED_FEATURE;
    }

    return pfnGetActivity( hEngine, pStats );
    #endif
}